

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
luna::Exception::
SetWhat<char_const*&,char_const(&)[3],char_const*&,char_const(&)[6],char_const*,char_const(&)[8]>
          (Exception *this,ostringstream *oss,char **arg,char (*args) [3],char **args_1,
          char (*args_2) [6],char **args_3,char (*args_4) [8])

{
  std::operator<<((ostream *)oss,*arg);
  SetWhat<char_const(&)[3],char_const*&,char_const(&)[6],char_const*,char_const(&)[8]>
            (this,oss,args,args_1,args_2,args_3,args_4);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }